

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::Aggregate::ByteSizeLong(Aggregate *this)

{
  uint uVar1;
  int32_t value;
  uint32_t *puVar2;
  string *value_00;
  size_t sVar3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  Aggregate *this_;
  Aggregate *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = 0;
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      value_00 = _internal_s_abi_cxx11_(this);
      sStack_58 = google::protobuf::internal::WireFormatLite::StringSize(value_00);
      sStack_58 = sStack_58 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::MessageSize<proto2_unittest::Aggregate>
                        ((this->field_0)._impl_.sub_);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::MessageSize<google::protobuf::FileOptions>
                        ((this->field_0)._impl_.file_);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::AggregateMessageSet>((this->field_0)._impl_.mset_);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::MessageSize<google::protobuf::Any>
                        ((this->field_0)._impl_.any_);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      value = _internal_i(this);
      sVar3 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(value);
      sStack_58 = sVar3 + sStack_58;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t Aggregate::ByteSizeLong() const {
  const Aggregate& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.Aggregate)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    // optional string s = 2;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_s());
    }
    // optional .proto2_unittest.Aggregate sub = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.sub_);
    }
    // optional .google.protobuf.FileOptions file = 4;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.file_);
    }
    // optional .proto2_unittest.AggregateMessageSet mset = 5;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.mset_);
    }
    // optional .google.protobuf.Any any = 6;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.any_);
    }
    // optional int32 i = 1;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_i());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}